

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

UniquePtr<CRYPTO_BUFFER> __thiscall
bssl::anon_unknown_0::BufferFromPEM(anon_unknown_0 *this,char *pem)

{
  int iVar1;
  size_t sVar2;
  BIO *pBVar3;
  CRYPTO_BUFFER *__p;
  size_t local_40;
  long data_len;
  uint8_t *data;
  char *header;
  char *name;
  UniquePtr<BIO> bio;
  char *pem_local;
  UniquePtr<CRYPTO_BUFFER> *ret;
  
  bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)
                 (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)pem;
  sVar2 = strlen(pem);
  pBVar3 = BIO_new_mem_buf(pem,(int)sVar2);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&name,(pointer)pBVar3);
  pBVar3 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&name);
  iVar1 = PEM_read_bio(pBVar3,&header,(char **)&data,(uchar **)&data_len,(long *)&local_40);
  if (iVar1 == 0) {
    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
  else {
    OPENSSL_free(header);
    OPENSSL_free(data);
    __p = CRYPTO_BUFFER_new((uint8_t *)data_len,local_40,(CRYPTO_BUFFER_POOL *)0x0);
    std::unique_ptr<crypto_buffer_st,bssl::internal::Deleter>::
    unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<crypto_buffer_st,bssl::internal::Deleter> *)this,__p);
    OPENSSL_free((void *)data_len);
  }
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&name);
  return (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<CRYPTO_BUFFER> BufferFromPEM(const char *pem) {
  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(pem, strlen(pem)));
  char *name, *header;
  uint8_t *data;
  long data_len;
  if (!PEM_read_bio(bio.get(), &name, &header, &data, &data_len)) {
    return nullptr;
  }
  OPENSSL_free(name);
  OPENSSL_free(header);

  auto ret = bssl::UniquePtr<CRYPTO_BUFFER>(
      CRYPTO_BUFFER_new(data, data_len, nullptr));
  OPENSSL_free(data);
  return ret;
}